

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_snd_static.cxx
# Opt level: O2

void __thiscall
read_sound_src::operator()(read_sound_src *this,sound_src_data **_sound_src,xr_reader *r)

{
  float *pfVar1;
  sound_src_data *value;
  size_t sVar2;
  bool compressed;
  
  value = (sound_src_data *)operator_new(0x50);
  (value->name)._M_dataplus._M_p = (pointer)&(value->name).field_2;
  (value->name)._M_string_length = 0;
  (value->name).field_2._M_local_buf[0] = '\0';
  *_sound_src = value;
  sVar2 = xray_re::xr_reader::find_chunk(r,0,&compressed,true);
  if ((sVar2 != 0) && ((compressed & 1U) == 0)) {
    xray_re::xr_reader::r_sz(r,(string *)value);
    xray_re::xr_reader::r_fvector3(r,&value->position);
    pfVar1 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
    value->volume = *pfVar1;
    (r->field_2).m_p = (uint8_t *)(pfVar1 + 2);
    value->freq = pfVar1[1];
    (r->field_2).m_p = (uint8_t *)(pfVar1 + 3);
    (value->active_time).field_0.field_0.x = (int)pfVar1[2];
    (r->field_2).m_p = (uint8_t *)(pfVar1 + 4);
    (value->active_time).field_0.field_0.y = (int)pfVar1[3];
    (r->field_2).m_p = (uint8_t *)(pfVar1 + 5);
    (value->play_time).field_0.field_0.x = (int)pfVar1[4];
    (r->field_2).m_p = (uint8_t *)(pfVar1 + 6);
    (value->play_time).field_0.field_0.y = (int)pfVar1[5];
    (r->field_2).m_p = (uint8_t *)(pfVar1 + 7);
    (value->pause_time).field_0.field_0.x = (int)pfVar1[6];
    (r->field_2).m_p = (uint8_t *)(pfVar1 + 8);
    (value->pause_time).field_0.field_0.y = (int)pfVar1[7];
    return;
  }
  __assert_fail("size && !compressed",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_snd_static.cxx"
                ,0x13,"void read_sound_src::operator()(sound_src_data *&, xr_reader &) const");
}

Assistant:

void operator()(sound_src_data*& _sound_src, xr_reader& r) const {
	sound_src_data* sound_src = new sound_src_data;
	_sound_src = sound_src;
	bool compressed;
	size_t size = r.find_chunk(0, &compressed);
	xr_assert(size && !compressed);
	r.r_sz(sound_src->name);
	r.r_fvector3(sound_src->position);
	sound_src->volume = r.r_float();
	sound_src->freq = r.r_float();
	r.r_i32vector2(sound_src->active_time);
	r.r_i32vector2(sound_src->play_time);
	r.r_i32vector2(sound_src->pause_time);
}